

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O2

void __thiscall
llvm::DWARFDie::getCallerFrame
          (DWARFDie *this,uint32_t *CallFile,uint32_t *CallLine,uint32_t *CallColumn,
          uint32_t *CallDiscriminator)

{
  uint64_t uVar1;
  Optional<llvm::DWARFFormValue> local_70;
  uint32_t *local_38;
  
  local_38 = CallDiscriminator;
  find(&local_70,this,DW_AT_call_file);
  uVar1 = dwarf::toUnsigned(&local_70,0);
  *CallFile = (uint32_t)uVar1;
  find(&local_70,this,DW_AT_call_line);
  uVar1 = dwarf::toUnsigned(&local_70,0);
  *CallLine = (uint32_t)uVar1;
  find(&local_70,this,DW_AT_call_column);
  uVar1 = dwarf::toUnsigned(&local_70,0);
  *CallColumn = (uint32_t)uVar1;
  find(&local_70,this,DW_AT_GNU_discriminator);
  uVar1 = dwarf::toUnsigned(&local_70,0);
  *local_38 = (uint32_t)uVar1;
  return;
}

Assistant:

void DWARFDie::getCallerFrame(uint32_t &CallFile, uint32_t &CallLine,
                              uint32_t &CallColumn,
                              uint32_t &CallDiscriminator) const {
  CallFile = toUnsigned(find(DW_AT_call_file), 0);
  CallLine = toUnsigned(find(DW_AT_call_line), 0);
  CallColumn = toUnsigned(find(DW_AT_call_column), 0);
  CallDiscriminator = toUnsigned(find(DW_AT_GNU_discriminator), 0);
}